

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_function.hpp
# Opt level: O2

Proxy_Function
chaiscript::dispatch::detail::
make_callable_impl<bool(chaiscript::dispatch::Dynamic_Object::*)(std::__cxx11::string_const&)const,false,true,false,false,bool,chaiscript::dispatch::Dynamic_Object_const&,std::__cxx11::string_const&>
          (element_type *func)

{
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> sVar1;
  Proxy_Function PVar2;
  anon_class_16_1_898bcfc2_for_m_f call;
  
  sVar1 = make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<bool(chaiscript::dispatch::Dynamic_Object_const&,std::__cxx11::string_const&),chaiscript::dispatch::detail::make_callable_impl<bool(chaiscript::dispatch::Dynamic_Object::*)(std::__cxx11::string_const&)const,false,true,false,false,bool,chaiscript::dispatch::Dynamic_Object_const&,std::__cxx11::string_const&>(bool(chaiscript::dispatch::Dynamic_Object::*&&)(std::__cxx11::string_const&)const,chaiscript::dispatch::detail::Function_Signature<bool,chaiscript::dispatch::detail::Function_Params<chaiscript::dispatch::Dynamic_Object_const&,std::__cxx11::string_const&>,false,true,false,false>)::_lambda(auto:1&&,(auto:2&&)___)_1_>,chaiscript::dispatch::detail::make_callable_impl<bool(chaiscript::dispatch::Dynamic_Object::*)(std::__cxx11::string_const&)const,false,true,false,false,bool,chaiscript::dispatch::Dynamic_Object_const&,std::__cxx11::string_const&>(bool(chaiscript::dispatch::Dynamic_Object::*&&)(std::__cxx11::string_const&)const,chaiscript::dispatch::detail::Function_Signature<bool,chaiscript::dispatch::detail::Function_Params<chaiscript::dispatch::Dynamic_Object_const&,std::__cxx11::string_const&>,false,true,false,false>)::_lambda(auto:1&&,(auto:2&&)___)_1_>
                    ((anon_class_16_1_898bcfc2_for_m_f *)func);
  PVar2.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount = sVar1.
                super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  PVar2.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = func;
  return (Proxy_Function)
         PVar2.
         super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto make_callable_impl(Func &&func, Function_Signature<Ret, Function_Params<Param...>, Is_Noexcept, Is_Member, Is_MemberObject, Is_Object>) {
      if constexpr (Is_MemberObject) {
        // we now that the Param pack will have only one element, so we are safe expanding it here
        return Proxy_Function(chaiscript::make_shared<dispatch::Proxy_Function_Base, dispatch::Attribute_Access<Ret, std::decay_t<Param>...>>(
            std::forward<Func>(func)));
      } else if constexpr (Is_Member) {
        // TODO some kind of bug is preventing forwarding of this noexcept for the lambda
        auto call = [func = std::forward<Func>(func)](auto &&obj, auto &&...param) /* noexcept(Is_Noexcept) */ -> decltype(auto) {
          return ((get_first_param(Function_Params<Param...>{}, obj).*func)(std::forward<decltype(param)>(param)...));
        };
        return Proxy_Function(
            chaiscript::make_shared<dispatch::Proxy_Function_Base, dispatch::Proxy_Function_Callable_Impl<Ret(Param...), decltype(call)>>(
                std::move(call)));
      } else {
        return Proxy_Function(
            chaiscript::make_shared<dispatch::Proxy_Function_Base, dispatch::Proxy_Function_Callable_Impl<Ret(Param...), std::decay_t<Func>>>(
                std::forward<Func>(func)));
      }
    }